

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# background_thread.c
# Opt level: O2

_Bool duckdb_je_background_threads_enable(tsd_t *tsd)

{
  void *pvVar1;
  undefined8 uVar2;
  long lVar3;
  background_thread_info_t *pbVar4;
  tsd_t *ptVar5;
  _Bool _Var6;
  uint uVar7;
  size_t i;
  size_t sVar8;
  ulong uVar9;
  uint i_1;
  background_thread_info_t *info;
  ulong uVar10;
  ulong uVar11;
  undefined1 *puVar12;
  ulong uStack_60;
  undefined1 auStack_58 [8];
  tsd_t *local_50;
  undefined1 *local_48;
  tsd_t *local_40;
  ulong local_38;
  
  lVar3 = -(duckdb_je_max_background_threads + 0xf & 0xfffffffffffffff0);
  puVar12 = auStack_58 + lVar3;
  for (sVar8 = 0; duckdb_je_max_background_threads != sVar8; sVar8 = sVar8 + 1) {
    puVar12[sVar8] = 0;
  }
  local_40 = tsd;
  *puVar12 = 1;
  *(undefined8 *)((long)&uStack_60 + lVar3) = 0xe52e26;
  uVar7 = duckdb_je_narenas_total_get();
  uVar9 = (ulong)uVar7;
  uVar10 = 0;
  *(undefined8 *)((long)&uStack_60 + lVar3) = 1;
  uVar11 = *(ulong *)((long)&uStack_60 + lVar3);
  local_38 = uVar9;
  local_48 = puVar12;
  for (; ptVar5 = local_40, pbVar4 = duckdb_je_background_thread_info, uVar11 < uVar9;
      uVar11 = uVar11 + 1) {
    if ((puVar12[uVar11 % duckdb_je_max_background_threads] == '\0') &&
       (duckdb_je_arenas[uVar11].repr != (void *)0x0)) {
      uVar9 = uVar11 % duckdb_je_max_background_threads;
      local_50 = (tsd_t *)(duckdb_je_background_thread_info + uVar9);
      info = (background_thread_info_t *)&duckdb_je_background_thread_info[uVar9].mtx;
      *(undefined8 *)((long)&uStack_60 + lVar3) = 0xe52e98;
      malloc_mutex_lock((tsdn_t *)ptVar5,(malloc_mutex_t *)info);
      ptVar5 = local_50;
      *(undefined8 *)((long)&uStack_60 + lVar3) = 0xe52ea1;
      background_thread_init(ptVar5,info);
      puVar12 = local_48;
      pbVar4[uVar9].mtx.field_0.field_0.locked.repr = false;
      *(undefined8 *)((long)&uStack_60 + lVar3) = 0xe52ec2;
      pthread_mutex_unlock((pthread_mutex_t *)((long)&pbVar4[uVar9].mtx.field_0 + 0x48));
      sVar8 = duckdb_je_max_background_threads;
      puVar12[uVar11 % duckdb_je_max_background_threads] = 1;
      uVar10 = (ulong)((int)uVar10 + 1);
      uVar9 = local_38;
      if (sVar8 == uVar10) break;
    }
  }
  ptVar5 = local_40;
  *(undefined8 *)((long)&uStack_60 + lVar3) = 0xe52ef4;
  _Var6 = background_thread_create_locked(ptVar5,0);
  uVar11 = local_38;
  if (!_Var6) {
    *(undefined8 *)((long)&uStack_60 + lVar3) = 1;
    uVar2 = *(undefined8 *)((long)&uStack_60 + lVar3);
    for (uVar9 = 0; uVar11 != uVar9; uVar9 = uVar9 + 1) {
      pvVar1 = duckdb_je_arenas[uVar9].repr;
      if (pvVar1 != (void *)0x0) {
        *(undefined8 *)((long)&uStack_60 + lVar3) = 0xe52f3f;
        duckdb_je_pa_shard_set_deferral_allowed
                  ((tsdn_t *)ptVar5,(pa_shard_t *)((long)pvVar1 + 0x29a8),SUB81(uVar2,0));
        uVar11 = local_38;
      }
    }
  }
  return _Var6;
}

Assistant:

bool
background_threads_enable(tsd_t *tsd) {
	assert(n_background_threads == 0);
	assert(background_thread_enabled());
	malloc_mutex_assert_owner(tsd_tsdn(tsd), &background_thread_lock);

	VARIABLE_ARRAY(bool, marked, max_background_threads);
	unsigned nmarked;
	for (size_t i = 0; i < max_background_threads; i++) {
		marked[i] = false;
	}
	nmarked = 0;
	/* Thread 0 is required and created at the end. */
	marked[0] = true;
	/* Mark the threads we need to create for thread 0. */
	unsigned narenas = narenas_total_get();
	for (unsigned i = 1; i < narenas; i++) {
		if (marked[i % max_background_threads] ||
		    arena_get(tsd_tsdn(tsd), i, false) == NULL) {
			continue;
		}
		background_thread_info_t *info = &background_thread_info[
		    i % max_background_threads];
		malloc_mutex_lock(tsd_tsdn(tsd), &info->mtx);
		assert(info->state == background_thread_stopped);
		background_thread_init(tsd, info);
		malloc_mutex_unlock(tsd_tsdn(tsd), &info->mtx);
		marked[i % max_background_threads] = true;
		if (++nmarked == max_background_threads) {
			break;
		}
	}

	bool err = background_thread_create_locked(tsd, 0);
	if (err) {
		return true;
	}
	for (unsigned i = 0; i < narenas; i++) {
		arena_t *arena = arena_get(tsd_tsdn(tsd), i, false);
		if (arena != NULL) {
			pa_shard_set_deferral_allowed(tsd_tsdn(tsd),
			    &arena->pa_shard, true);
		}
	}
	return false;
}